

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O0

void __thiscall L18_1::Useless::showData(Useless *this)

{
  ostream *poVar1;
  int local_14;
  int i;
  Useless *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Address: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->pc);
  std::operator<<(poVar1," ; ");
  if (this->n == 0) {
    std::operator<<((ostream *)&std::cout,"(instance empty)");
  }
  else {
    for (local_14 = 0; local_14 < this->n; local_14 = local_14 + 1) {
      std::operator<<((ostream *)&std::cout,this->pc[local_14]);
    }
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Useless::showData() const {
        cout << "Address: " << (void *) pc << " ; ";
        if (n == 0) {
            cout << "(instance empty)";
        } else {
            for(int i = 0; i < n; i++) {
                cout << pc[i];
            }
        }
        cout << endl;
    }